

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void basic_suite::test_null_white(void)

{
  char input [9];
  decoder_type decoder;
  value local_178 [2];
  value_type local_170 [16];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_170,"  null  ",9);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            (&local_160,(value_type (*) [9])local_170);
  local_178[0] = local_160.current.code;
  local_178[1] = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xe4,"void basic_suite::test_null_white()",local_178,local_178 + 1);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[5]>
            ("decoder.literal()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xe5,"void basic_suite::test_null_white()",&local_160.current.view,"null");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[3]>
            ("decoder.tail()","\"  \"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xe6,"void basic_suite::test_null_white()",&local_160,"  ");
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xe8,"void basic_suite::test_null_white()",local_178,local_178 + 1);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xe9,"void basic_suite::test_null_white()",&local_160,"");
  return;
}

Assistant:

void test_null_white()
{
    const char input[] = "  null  ";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "null");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "  ");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "");
}